

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

affine3f * pbrt::math::affine3f::rotate(affine3f *__return_storage_ptr__,vec3f *_u,float r)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar8 = _u->x;
  uVar1 = _u->y;
  uVar2 = _u->z;
  fVar5 = 1.0 / SQRT((float)uVar2 * (float)uVar2 + fVar8 * fVar8 + (float)uVar1 * (float)uVar1);
  fVar6 = fVar5 * (float)uVar1;
  fVar7 = fVar5 * (float)uVar2;
  fVar3 = sinf(r);
  fVar4 = cosf(r);
  fVar8 = fVar8 * fVar5;
  fVar5 = 1.0 - fVar4;
  (__return_storage_ptr__->l).vx.x = (1.0 - fVar8 * fVar8) * fVar4 + fVar8 * fVar8;
  (__return_storage_ptr__->l).vx.y = fVar3 * fVar7 + fVar8 * fVar6 * fVar5;
  (__return_storage_ptr__->l).vx.z = -(fVar3 * fVar6) + fVar8 * fVar7 * fVar5;
  (__return_storage_ptr__->l).vy.x = -(fVar3 * fVar7) + fVar8 * fVar6 * fVar5;
  (__return_storage_ptr__->l).vy.y = (1.0 - fVar6 * fVar6) * fVar4 + fVar6 * fVar6;
  (__return_storage_ptr__->l).vy.z = fVar3 * fVar8 + fVar5 * fVar6 * fVar7;
  (__return_storage_ptr__->l).vz.x = fVar3 * fVar6 + fVar5 * fVar8 * fVar7;
  (__return_storage_ptr__->l).vz.y = -(fVar3 * fVar8) + fVar5 * fVar6 * fVar7;
  (__return_storage_ptr__->l).vz.z = (1.0 - fVar7 * fVar7) * fVar4 + fVar7 * fVar7;
  (__return_storage_ptr__->p).x = 0.0;
  (__return_storage_ptr__->p).y = 0.0;
  (__return_storage_ptr__->p).z = 0.0;
  return __return_storage_ptr__;
}

Assistant:

inline affine3f affine3f::rotate(const vec3f& _u, float r) {
      vec3f u = normalize(_u);
      float s = sinf(r), c = cosf(r);
      mat3f l = mat3f(vec3f(u.x*u.x+(1-u.x*u.x)*c, u.x*u.y*(1-c)+u.z*s, u.x*u.z*(1-c)-u.y*s),
                      vec3f(u.x*u.y*(1-c)-u.z*s, u.y*u.y+(1-u.y*u.y)*c, u.y*u.z*(1-c)+u.x*s),   
                      vec3f(u.x*u.z*(1-c)+u.y*s, u.y*u.z*(1-c)-u.x*s, u.z*u.z+(1-u.z*u.z)*c));
      return affine3f(l, vec3f(0));
    }